

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

void __thiscall crnlib::dynamic_string::translate_lf_to_crlf(dynamic_string *this)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint local_34;
  int cur_char;
  uint i;
  int prev_char;
  undefined1 local_20 [8];
  dynamic_string tmp;
  dynamic_string *this_local;
  
  tmp.m_pStr = (char *)this;
  iVar2 = find_left(this,'\n');
  if (-1 < iVar2) {
    dynamic_string((dynamic_string *)local_20);
    ensure_buf((dynamic_string *)local_20,this->m_len + 2,true);
    cur_char = -1;
    for (local_34 = 0; uVar3 = get_len(this), local_34 < uVar3; local_34 = local_34 + 1) {
      cVar1 = operator[](this,local_34);
      iVar2 = (int)cVar1;
      if ((iVar2 == 10) && (cur_char != 0xd)) {
        append_char((dynamic_string *)local_20,0xd);
      }
      append_char((dynamic_string *)local_20,iVar2);
      cur_char = iVar2;
    }
    swap(this,(dynamic_string *)local_20);
    ~dynamic_string((dynamic_string *)local_20);
  }
  return;
}

Assistant:

void dynamic_string::translate_lf_to_crlf()
    {
        if (find_left(0x0A) < 0)
        {
            return;
        }

        dynamic_string tmp;
        tmp.ensure_buf(m_len + 2);

        // normal sequence is 0x0D 0x0A (CR LF, \r\n)

        int prev_char = -1;
        for (uint i = 0; i < get_len(); i++)
        {
            const int cur_char = (*this)[i];

            if ((cur_char == 0x0A) && (prev_char != 0x0D))
            {
                tmp.append_char(0x0D);
            }

            tmp.append_char(cur_char);

            prev_char = cur_char;
        }

        swap(tmp);
    }